

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxOut::SetCommitment
          (ConfidentialTxOut *this,ConfidentialAssetId *asset,ConfidentialValue *confidential_value,
          ConfidentialNonce *nonce,ByteData *surjection_proof,ByteData *range_proof)

{
  ByteData *in_stack_ffffffffffffffb8;
  ByteData *range_proof_local;
  ByteData *surjection_proof_local;
  ConfidentialNonce *nonce_local;
  ConfidentialValue *confidential_value_local;
  ConfidentialAssetId *asset_local;
  ConfidentialTxOut *this_local;
  
  ConfidentialAssetId::operator=(&this->asset_,asset);
  ConfidentialValue::operator=(&this->confidential_value_,confidential_value);
  SetNonce(this,nonce);
  ByteData::operator=((ByteData *)this,in_stack_ffffffffffffffb8);
  ByteData::operator=((ByteData *)this,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void ConfidentialTxOut::SetCommitment(
    const ConfidentialAssetId &asset,
    const ConfidentialValue &confidential_value,
    const ConfidentialNonce &nonce, const ByteData &surjection_proof,
    const ByteData &range_proof) {
  asset_ = asset;
  confidential_value_ = confidential_value;
  SetNonce(nonce);
  surjection_proof_ = surjection_proof;
  range_proof_ = range_proof;
}